

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int lj_cf_collectgarbage(lua_State *L)

{
  undefined8 uVar1;
  int what;
  int32_t data_00;
  int iVar2;
  undefined1 auVar3 [16];
  int res;
  int32_t data;
  int opt;
  lua_State *L_local;
  
  what = lj_lib_checkopt(L,1,2,anon_var_dwarf_4d07d);
  data_00 = lj_lib_optint(L,2,0);
  if (what == 3) {
    uVar1 = *(undefined8 *)((L->glref).ptr64 + 0x10);
    auVar3._8_4_ = (int)((ulong)uVar1 >> 0x20);
    auVar3._0_8_ = uVar1;
    auVar3._12_4_ = 0x45300000;
    L->top->n = ((auVar3._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) / 1024.0;
  }
  else {
    iVar2 = lua_gc(L,what,data_00);
    if ((what == 5) || (what == 9)) {
      L->top->u64 = (long)(iVar2 + 1) << 0x2f ^ 0xffffffffffffffff;
    }
    else {
      L->top->n = (double)iVar2;
    }
  }
  L->top = L->top + 1;
  return 1;
}

Assistant:

LJLIB_CF(collectgarbage)
{
  int opt = lj_lib_checkopt(L, 1, LUA_GCCOLLECT,  /* ORDER LUA_GC* */
    "\4stop\7restart\7collect\5count\1\377\4step\10setpause\12setstepmul\1\377\11isrunning");
  int32_t data = lj_lib_optint(L, 2, 0);
  if (opt == LUA_GCCOUNT) {
    setnumV(L->top, (lua_Number)G(L)->gc.total/1024.0);
  } else {
    int res = lua_gc(L, opt, data);
    if (opt == LUA_GCSTEP || opt == LUA_GCISRUNNING)
      setboolV(L->top, res);
    else
      setintV(L->top, res);
  }
  L->top++;
  return 1;
}